

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chipset.hpp
# Opt level: O1

void __thiscall
Amiga::Chipset::perform<CPU::MC68000::Microcycle<96u>>(Chipset *this,Microcycle<96U> *cycle)

{
  undefined1 uVar1;
  uint uVar2;
  ssize_t sVar3;
  size_t in_RCX;
  uint __fd;
  SlicedInt16 local_c [2];
  
  __fd = *cycle->address & 0x1fe;
  uVar2 = (cycle->super_MicrocycleOperationStorage<96U>).operation;
  if ((uVar2 & 4) == 0) {
    local_c[0] = *cycle->value;
    uVar1 = *(undefined1 *)cycle->value;
    local_c[1] = (SlicedInt16)CONCAT11(uVar1,uVar1);
    write(this,__fd,(void *)(ulong)(ushort)local_c[uVar2 & 1],1);
    return;
  }
  sVar3 = read(this,__fd,(void *)0x1,in_RCX);
  uVar2 = (cycle->super_MicrocycleOperationStorage<96U>).operation;
  if ((uVar2 & 4) != 0) {
    if ((uVar2 & 2) == 0) {
      (cycle->value->field_1).b =
           (uint8_t)(((uint)sVar3 & 0xffff) >> ((~(byte)*cycle->address & 1) << 3));
    }
    else {
      *cycle->value = SUB82(sVar3,0);
    }
    return;
  }
  __assert_fail("this->operation & Operation::Read",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Amiga/../../Processors/68000/68000.hpp"
                ,0x136,"void CPU::MC68000::Microcycle<>::set_value16(uint16_t) const [op = 96]");
}

Assistant:

void perform(const Microcycle &cycle) {
			const uint32_t register_address = *cycle.address & ChipsetAddressMask;
			if(cycle.operation & CPU::MC68000::Operation::Read) {
				cycle.set_value16(read(register_address));
			} else {
				write(register_address, cycle.value16());
			}
		}